

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

Ref<anurbs::Box<3L>_> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Box<3L>_>::replace
          (PythonDataType<anurbs::Model,_anurbs::Box<3L>_> *this,Model *self,size_t index,
          Pointer<anurbs::Box<3L>_> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Box<3L>_> RVar1;
  __shared_ptr<anurbs::Box<3L>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<anurbs::Box<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&data->super___shared_ptr<anurbs::Box<3L>,_(__gnu_cxx::_Lock_policy)2>);
  Model::replace<anurbs::Box<3l>>((Model *)this,(size_t)self,(Pointer<anurbs::Box<3L>_> *)index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::Box<3L>_>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> replace(TModel& self, const size_t index,
        Pointer<TData> data)
    {
        return self.template replace<TData>(index, data);
    }